

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmFRestore<(moira::Instr)197,(moira::Mode)2,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  Ea<(moira::Mode)2,_2> result;
  u32 local_14;
  ushort local_10;
  
  cVar2 = 'f';
  lVar3 = 0;
  do {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = cVar2;
    cVar2 = "frestore"[lVar3 + 1];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    pcVar4 = str->ptr;
    do {
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
      pcVar4 = str->ptr;
    } while (pcVar4 < str->base + iVar1);
  }
  local_10 = op & 7;
  local_14 = *addr;
  StrWriter::operator<<(str,(Ea<(moira::Mode)2,_2> *)&local_14);
  return;
}

Assistant:

void
Moira::dasmFRestore(StrWriter &str, u32 &addr, u16 op) const
{
    auto dn = _____________xxx (op);

    str << Ins<I>{} << str.tab << Op<M, S>(dn, addr);
}